

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,CallExpression *expression)

{
  vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_> *this_00;
  Expression *pEVar1;
  size_type sVar2;
  reference ppEVar3;
  vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_> *arguments;
  int i;
  CallExpression *expression_local;
  PrettyPrinter *this_local;
  
  this_00 = CallExpression::getArguments(expression);
  pEVar1 = CallExpression::getExpression(expression);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  std::operator<<((ostream *)&this->field_0x20,"(");
  sVar2 = std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::size(this_00);
  if (sVar2 != 0) {
    arguments._4_4_ = 0;
    while( true ) {
      sVar2 = std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::size(this_00);
      if (sVar2 - 1 <= (ulong)(long)arguments._4_4_) break;
      ppEVar3 = std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::operator[]
                          (this_00,(long)arguments._4_4_);
      (**((*ppEVar3)->super_Statement).super_ASTNode._vptr_ASTNode)(*ppEVar3,this);
      std::operator<<((ostream *)&this->field_0x20,", ");
      arguments._4_4_ = arguments._4_4_ + 1;
    }
    ppEVar3 = std::vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>::operator[]
                        (this_00,(long)arguments._4_4_);
    (**((*ppEVar3)->super_Statement).super_ASTNode._vptr_ASTNode)(*ppEVar3,this);
  }
  std::operator<<((ostream *)&this->field_0x20,")");
  return;
}

Assistant:

void PrettyPrinter::visit(CallExpression* expression) {
    int i;
    std::vector<Expression*>& arguments = expression->getArguments();

    expression->getExpression()->accept(this);
    output << "(";

    if (arguments.size() > 0) {
        for (i = 0; i < arguments.size() - 1; ++i) {
            arguments[i]->accept(this);
            output << ", ";
        }

        arguments[i]->accept(this);
    }

    output << ")";
}